

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O3

bool __thiscall
bloaty::pe::PEObjectFile::GetDisassemblyInfo
          (PEObjectFile *this,string_view param_1,DataSource param_2,DisassemblyInfo *param_3)

{
  size_t in_R9;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  if (0 < verbose_level) {
    local_28 = 0;
    local_20 = 0;
    local_30 = &local_20;
    absl::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)&local_30,(Nonnull<std::string_*>)0x27,
               (string_view)ZEXT816(0x300362),(Nullable<const_absl::string_view_*>)0x0,in_R9);
    printf("WARNING: %s\n",local_30);
    if (local_30 != &local_20) {
      operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
    }
  }
  return false;
}

Assistant:

bool GetDisassemblyInfo(string_view /*symbol*/, DataSource /*symbol_source*/,
                          DisassemblyInfo* /*info*/) const override {
    WARN("PE files do not support disassembly yet");
    return false;
  }